

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consuming_buffers.hpp
# Opt level: O1

void __thiscall
asio::detail::
consuming_buffers<asio::const_buffer,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>_>
::consume(consuming_buffers<asio::const_buffer,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>_>
          *this,size_t size)

{
  pointer pcVar1;
  pointer pcVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  this->total_consumed_ = this->total_consumed_ + size;
  pcVar1 = (this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_start + this->next_elem_;
  if (size != 0 && pcVar2 != pcVar1) {
    sVar3 = this->next_elem_;
    sVar4 = this->next_elem_offset_;
    do {
      uVar6 = pcVar2->size_ - sVar4;
      if (pcVar2->size_ < sVar4) {
        uVar6 = 0;
      }
      uVar5 = size - uVar6;
      if (size < uVar6) {
        sVar4 = sVar4 + size;
        this->next_elem_offset_ = sVar4;
        uVar5 = 0;
      }
      else {
        this->next_elem_offset_ = 0;
        sVar3 = sVar3 + 1;
        this->next_elem_ = sVar3;
        pcVar2 = pcVar2 + 1;
        sVar4 = 0;
      }
    } while ((pcVar2 != pcVar1) && (size = uVar5, uVar5 != 0));
  }
  return;
}

Assistant:

void consume(std::size_t size)
  {
    total_consumed_ += size;

    Buffer_Iterator next = asio::buffer_sequence_begin(buffers_);
    Buffer_Iterator end = asio::buffer_sequence_end(buffers_);

    std::advance(next, next_elem_);
    while (next != end && size > 0)
    {
      Buffer next_buf = Buffer(*next) + next_elem_offset_;
      if (size < next_buf.size())
      {
        next_elem_offset_ += size;
        size = 0;
      }
      else
      {
        size -= next_buf.size();
        next_elem_offset_ = 0;
        ++next_elem_;
        ++next;
      }
    }
  }